

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_top_n.cpp
# Opt level: O1

unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true> __thiscall
duckdb::PhysicalTopN::GetLocalSinkState(PhysicalTopN *this,ExecutionContext *context)

{
  ThreadContext *limit;
  Pipeline *offset;
  _func_int **pp_Var1;
  ExecutionContext *in_RDX;
  
  pp_Var1 = (_func_int **)operator_new(0x340);
  limit = context[6].thread;
  offset = context[6].pipeline.ptr;
  *(undefined4 *)(pp_Var1 + 1) = 0xffffffff;
  *(undefined4 *)((long)pp_Var1 + 0xc) = 0xffffffff;
  *(undefined4 *)(pp_Var1 + 2) = 0xffffffff;
  *(undefined4 *)((long)pp_Var1 + 0x14) = 0xffffffff;
  *(undefined1 (*) [16])(pp_Var1 + 3) = (undefined1  [16])0x0;
  pp_Var1[5] = (_func_int *)0x0;
  *pp_Var1 = (_func_int *)&PTR__TopNLocalSinkState_019cb608;
  TopNHeap::TopNHeap((TopNHeap *)(pp_Var1 + 6),in_RDX,
                     (vector<duckdb::LogicalType,_true> *)&context[1].pipeline,
                     (vector<duckdb::BoundOrderByNode,_true> *)&context[5].thread,(idx_t)limit,
                     (idx_t)offset);
  (this->super_PhysicalOperator)._vptr_PhysicalOperator = pp_Var1;
  return (unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>)
         (unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>)this;
}

Assistant:

unique_ptr<LocalSinkState> PhysicalTopN::GetLocalSinkState(ExecutionContext &context) const {
	return make_uniq<TopNLocalSinkState>(context, types, orders, limit, offset);
}